

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlValidateUtf8(xmlParserCtxtPtr ctxt,xmlChar *str,size_t len,int partial)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  
  bVar2 = *str;
  if (0xc1 < bVar2) {
    if (bVar2 < 0xe0) {
      if (1 < len) goto LAB_0016ab7d;
    }
    else {
      if (bVar2 < 0xf0) {
        iVar4 = 3;
        bVar5 = 3;
        if (2 < len) {
          bVar5 = 2;
          if ((CONCAT11(str[1],str[2]) & 0xc0c0) == 0x8080) {
            uVar3 = ((uint)str[1] << 8 | (uint)bVar2 << 0x10) & 0xf2000;
            bVar5 = (uVar3 == 0xd2000 || uVar3 == 0) * '\x02';
          }
        }
      }
      else {
        bVar5 = 3;
        if (3 < len) {
          bVar5 = ((uint)bVar2 * 0x1000000 + (uint)str[1] * 0x10000 + 0xb700000 < 0xfc000000 ||
                  (((uint)(ushort)(*(ushort *)(str + 2) << 8 | *(ushort *)(str + 2) >> 8) |
                   (uint)str[1] * 0x10000) & 0xc0c0c0) != 0x808080) * '\x02';
        }
        iVar4 = 4;
      }
      if (bVar5 < 2) {
        return iVar4;
      }
      if (bVar5 == 2) goto LAB_0016ab7d;
    }
    if (partial != 0) {
      return 0;
    }
  }
LAB_0016ab7d:
  if ((ctxt->input->flags & 0x20) == 0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_HTML,XML_ERR_INVALID_ENCODING,XML_ERR_ERROR,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"Invalid bytes in character encoding",
               0,0);
    piVar1 = &ctxt->input->flags;
    *piVar1 = *piVar1 | 0x20;
  }
  return -1;
}

Assistant:

static int
htmlValidateUtf8(xmlParserCtxtPtr ctxt, const xmlChar *str, size_t len,
                 int partial) {
    unsigned c = str[0];
    int size;

    if (c < 0xC2) {
        goto invalid;
    } else if (c < 0xE0) {
        if (len < 2)
            goto incomplete;
        if ((str[1] & 0xC0) != 0x80)
            goto invalid;
        size = 2;
    } else if (c < 0xF0) {
        unsigned v;

        if (len < 3)
            goto incomplete;

        v = str[1] << 8 | str[2]; /* hint to generate 16-bit load */
        v |= c << 16;

        if (((v & 0x00C0C0) != 0x008080) ||
            ((v & 0x0F2000) == 0x000000) ||
            ((v & 0x0F2000) == 0x0D2000))
            goto invalid;

        size = 3;
    } else {
        unsigned v;

        if (len < 4)
            goto incomplete;

        v = c << 24 | str[1] << 16 | str[2] << 8 | str[3];

        if (((v & 0x00C0C0C0) != 0x00808080) ||
            (v < 0xF0900000) || (v >= 0xF4900000))
            goto invalid;

        size = 4;
    }

    return(size);

incomplete:
    if (partial)
        return(0);

invalid:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
                     "Invalid bytes in character encoding", NULL, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }

    return(-1);
}